

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall QMimeBinaryProvider::ensureLoaded(QMimeBinaryProvider *this)

{
  long lVar1;
  bool bVar2;
  pointer this_00;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString cacheFileName;
  pointer in_stack_ffffffffffffff68;
  qsizetype *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  QMimeBinaryProvider *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                      *)0x8f8914);
  if (bVar2) {
    bVar2 = checkCacheChanged(in_stack_ffffffffffffff98);
    if (!bVar2) goto LAB_008f8a4e;
    *(undefined1 *)&in_RDI[3].d.size = 0;
    std::
    map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
    ::clear((map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
             *)0x8f8a1c);
  }
  else {
    in_stack_ffffffffffffff70 = &(in_RDI->d).size;
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
    ::operator+((QString *)in_stack_ffffffffffffff70,(QLatin1String *)in_stack_ffffffffffffff68);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_QLatin1String> *)in_stack_ffffffffffffff68);
    std::make_unique<QMimeBinaryProvider::CacheFile,QString_const&>(in_RDI);
    std::
    unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::operator=((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                 *)in_stack_ffffffffffffff70,
                (unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                 *)in_stack_ffffffffffffff68);
    std::
    unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::~unique_ptr((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                   *)in_stack_ffffffffffffff70);
    *(undefined1 *)&in_RDI[3].d.size = 0;
    std::
    map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
    ::clear((map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
             *)0x8f89d0);
    QString::~QString((QString *)0x8f89da);
  }
  this_00 = std::
            unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
            ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                          *)0x8f8a30);
  bVar2 = CacheFile::isValid(this_00);
  if (!bVar2) {
    std::
    unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::reset((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
LAB_008f8a4e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeBinaryProvider::ensureLoaded()
{
    if (!m_cacheFile) {
        const QString cacheFileName = m_directory + "/mime.cache"_L1;
        m_cacheFile = std::make_unique<CacheFile>(cacheFileName);
        m_mimetypeListLoaded = false;
        m_mimetypeExtra.clear();
    } else {
        if (checkCacheChanged()) {
            m_mimetypeListLoaded = false;
            m_mimetypeExtra.clear();
        } else {
            return; // nothing to do
        }
    }
    if (!m_cacheFile->isValid()) // verify existence and version
        m_cacheFile.reset();
}